

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

Vec_Wec_t * Abc_NtkFxRetrieve(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  int iVar6;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  char *pSop;
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x90,"Vec_Wec_t *Abc_NtkFxRetrieve(Abc_Ntk_t *)");
  }
  p = (Vec_Wec_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pVVar7 = (Vec_Int_t *)calloc(1000,0x10);
  p->pArray = pVVar7;
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      pvVar4 = pVVar8->pArray[lVar15];
      if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
        pSop = *(char **)((long)pvVar4 + 0x38);
        iVar6 = Abc_SopGetVarNum(pSop);
        if (iVar6 != *(int *)((long)pvVar4 + 0x1c)) {
          __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                        ,0x96,"Vec_Wec_t *Abc_NtkFxRetrieve(Abc_Ntk_t *)");
        }
        if (*pSop != '\0') {
LAB_002596c3:
          pVVar7 = Vec_WecPushLevel(p);
          Vec_IntPush(pVVar7,*(int *)((long)pvVar4 + 0x10));
          lVar16 = 0;
          do {
            bVar2 = pSop[lVar16];
            if (bVar2 < 0x31) {
              if (bVar2 == 0x30) {
                iVar9 = *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar16 * 4);
                if (iVar9 < 0) {
LAB_002597d6:
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                ,0x10b,"int Abc_Var2Lit(int, int)");
                }
                iVar9 = iVar9 * 2 + 1;
LAB_0025971a:
                Vec_IntPush(pVVar7,iVar9);
              }
              else if ((bVar2 == 0) || (bVar2 == 0x20)) goto LAB_00259732;
            }
            else if (bVar2 == 0x31) {
              iVar9 = *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar16 * 4);
              if (iVar9 < 0) goto LAB_002597d6;
              iVar9 = iVar9 * 2;
              goto LAB_0025971a;
            }
            lVar16 = lVar16 + 1;
          } while( true );
        }
      }
LAB_002597a9:
      lVar15 = lVar15 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar15 < pVVar8->nSize);
  }
  return p;
LAB_00259732:
  iVar9 = pVVar7->nSize;
  if (2 < iVar9) {
    piVar5 = pVVar7->pArray;
    uVar10 = 1;
    uVar11 = 0;
    do {
      uVar14 = uVar11 & 0xffffffff;
      uVar12 = uVar10;
      do {
        uVar13 = (uint)uVar12;
        if (piVar5[(long)(int)(uint)uVar14 + 1] <= piVar5[uVar12 + 1]) {
          uVar13 = (uint)uVar14;
        }
        uVar12 = uVar12 + 1;
        uVar14 = (ulong)uVar13;
      } while (iVar9 - 1 != uVar12);
      iVar3 = piVar5[uVar11 + 1];
      piVar5[uVar11 + 1] = piVar5[(long)(int)uVar13 + 1];
      uVar11 = uVar11 + 1;
      piVar5[(long)(int)uVar13 + 1] = iVar3;
      uVar10 = uVar10 + 1;
    } while (uVar11 != iVar9 - 2);
  }
  pcVar1 = pSop + (iVar6 + 3);
  pSop = pSop + (iVar6 + 3);
  if (*pcVar1 == '\0') goto LAB_002597a9;
  goto LAB_002596c3;
}

Assistant:

Vec_Wec_t * Abc_NtkFxRetrieve( Abc_Ntk_t * pNtk )
{
    Vec_Wec_t * vCubes;
    Vec_Int_t * vCube;
    Abc_Obj_t * pNode;
    char * pCube, * pSop;
    int nVars, i, v, Lit;
    assert( Abc_NtkIsSopLogic(pNtk) );
    vCubes = Vec_WecAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
//        if ( nVars < 2 ) continue;
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, Abc_ObjId(pNode) );
            Abc_CubeForEachVar( pCube, Lit, v )
            {
                if ( Lit == '0' )
                    Vec_IntPush( vCube, Abc_Var2Lit(Abc_ObjFaninId(pNode, v), 1) );
                else if ( Lit == '1' )
                    Vec_IntPush( vCube, Abc_Var2Lit(Abc_ObjFaninId(pNode, v), 0) );
            }
            Vec_IntSelectSort( Vec_IntArray(vCube) + 1, Vec_IntSize(vCube) - 1 );
        }
    }
    return vCubes;
}